

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O2

xr_reader * __thiscall
xray_re::xr_reader::open_chunk_next(xr_reader *this,uint32_t *_id,xr_reader *prev)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint __line;
  uint32_t *puVar5;
  xr_reader *pxVar6;
  char *__assertion;
  ulong _codesize;
  uint8_t *data;
  size_t real_size;
  
  if (prev == (xr_reader *)0x0) {
    puVar5 = (uint32_t *)this->m_data;
    this->m_next = (uint8_t *)puVar5;
  }
  else {
    (*prev->_vptr_xr_reader[1])(prev);
    puVar5 = (uint32_t *)this->m_next;
  }
  puVar3 = (uint32_t *)this->m_end;
  if (puVar3 <= puVar5) {
    return (xr_reader *)0x0;
  }
  puVar1 = puVar5 + 2;
  if (puVar3 < puVar1) {
    __assertion = "m_next + 8 <= m_end";
    __line = 0x4a;
  }
  else {
    (this->field_2).m_p = (uint8_t *)(puVar5 + 1);
    uVar2 = *puVar5;
    (this->field_2).m_p = (uint8_t *)puVar1;
    _codesize = (ulong)puVar5[1];
    if ((uint32_t *)((long)puVar1 + _codesize) <= puVar3) {
      this->m_next = (uint8_t *)((long)puVar1 + _codesize);
      *_id = uVar2;
      if (-1 < (int)uVar2) {
        pxVar6 = (xr_reader *)operator_new(0x28);
        puVar4 = (this->field_2).m_p;
        pxVar6->_vptr_xr_reader = (_func_int **)&PTR__xr_reader_00239920;
        pxVar6->m_data = puVar4;
        (pxVar6->field_2).m_p = puVar4;
        pxVar6->m_next = puVar4;
        pxVar6->m_end = puVar4 + _codesize;
        return pxVar6;
      }
      xr_lzhuf::decompress(&data,&real_size,(this->field_2).m_p,_codesize);
      pxVar6 = (xr_reader *)operator_new(0x28);
      pxVar6->m_data = data;
      (pxVar6->field_2).m_p = data;
      pxVar6->m_next = data;
      pxVar6->m_end = data + real_size;
      pxVar6->_vptr_xr_reader = (_func_int **)&PTR__xr_temp_reader_00239940;
      return pxVar6;
    }
    __assertion = "m_p + size <= m_end";
    __line = 0x4e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                ,__line,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)");
}

Assistant:

xr_reader* xr_reader::open_chunk_next(uint32_t& _id, xr_reader* prev)
{
	if (prev)
		delete prev;
	else
		m_next = m_data;
	if (m_next < m_end) {
		assert(m_next + 8 <= m_end);
		m_p = m_next;
		uint32_t id = r_u32();
		uint32_t size = r_u32();
		assert(m_p + size <= m_end);
		m_next = m_p + size;
		_id = id;
		if (id & CHUNK_COMPRESSED) {
			size_t real_size;
			uint8_t* data;
			xr_lzhuf::decompress(data, real_size, m_p, size);
			return new xr_temp_reader(data, real_size);
		} else {
			return new xr_reader(m_p, size);
		}
	}
	return 0;
}